

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O2

duckdb_state
duckdb::deprecated_duckdb_translate_column
          (MaterializedQueryResult *result,duckdb_column *column,idx_t col)

{
  PhysicalType PVar1;
  size_t __size;
  bool bVar2;
  idx_t row_id;
  ColumnDataCollection *this;
  bool *pbVar3;
  idx_t iVar4;
  void *pvVar5;
  DataChunk *this_00;
  reference vector;
  size_t sVar6;
  reference pvVar7;
  runtime_error *this_01;
  PhysicalType type;
  idx_t k;
  ulong idx;
  vector<duckdb::LogicalType,_true> *this_02;
  long lVar8;
  duckdb_state dVar9;
  initializer_list<unsigned_long> __l;
  vector<unsigned_long,_true> column_ids;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1a8;
  ColumnDataChunkIterationHelper local_190;
  ColumnDataChunkIterator __end2;
  ColumnDataChunkIterator __begin2;
  
  this = MaterializedQueryResult::Collection(result);
  __size = this->count;
  pbVar3 = (bool *)malloc(__size);
  column->deprecated_nullmask = pbVar3;
  iVar4 = GetCTypeSize(column->deprecated_type);
  if (iVar4 == 0) {
    for (sVar6 = 0; __size != sVar6; sVar6 = sVar6 + 1) {
      pbVar3[sVar6] = false;
    }
    return DuckDBSuccess;
  }
  pvVar5 = malloc(iVar4 * __size);
  column->deprecated_data = pvVar5;
  if (pbVar3 == (bool *)0x0) {
    return DuckDBError;
  }
  if (pvVar5 == (void *)0x0) {
    return DuckDBError;
  }
  __l._M_len = 1;
  __l._M_array = (iterator)&__begin2;
  __begin2.collection = (ColumnDataCollection *)col;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&column_ids,__l,
             (allocator_type *)&__end2);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&column_ids);
  ColumnDataCollection::Chunks(&local_190,this,(vector<unsigned_long,_true> *)&local_1a8);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1a8);
  ColumnDataChunkIterationHelper::begin(&__begin2,&local_190);
  ColumnDataChunkIterationHelper::end(&__end2,&local_190);
  lVar8 = 0;
  while (bVar2 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                           (&__begin2,&__end2), bVar2) {
    this_00 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&__begin2);
    for (idx = 0; idx < this_00->count; idx = idx + 1) {
      vector = vector<duckdb::Vector,_true>::get<true>(&this_00->data,0);
      bVar2 = FlatVector::IsNull(vector,idx);
      column->deprecated_nullmask[lVar8] = bVar2;
      lVar8 = lVar8 + 1;
    }
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&__begin2);
  }
  ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&__end2);
  ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&__begin2);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_190.column_ids);
  this_02 = &(result->super_QueryResult).super_BaseQueryResult.types;
  pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(this_02,col);
  dVar9 = DuckDBError;
  switch(pvVar7->id_) {
  case BOOLEAN:
    WriteData<bool,bool,duckdb::CStandardConverter>(column,this,&column_ids);
    break;
  case TINYINT:
    WriteData<signed_char,signed_char,duckdb::CStandardConverter>(column,this,&column_ids);
    break;
  case SMALLINT:
    WriteData<short,short,duckdb::CStandardConverter>(column,this,&column_ids);
    break;
  case INTEGER:
    WriteData<int,int,duckdb::CStandardConverter>(column,this,&column_ids);
    break;
  case BIGINT:
    WriteData<long,long,duckdb::CStandardConverter>(column,this,&column_ids);
    break;
  case DATE:
    WriteData<duckdb::date_t,duckdb::date_t,duckdb::CStandardConverter>(column,this,&column_ids);
    break;
  case TIME:
    WriteData<duckdb::dtime_t,duckdb::dtime_t,duckdb::CStandardConverter>(column,this,&column_ids);
    break;
  case TIMESTAMP_SEC:
    WriteData<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::CTimestampSecConverter>
              (column,this,&column_ids);
    break;
  case TIMESTAMP_MS:
    WriteData<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::CTimestampMsConverter>
              (column,this,&column_ids);
    break;
  case TIMESTAMP:
  case TIMESTAMP_TZ:
    WriteData<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::CStandardConverter>
              (column,this,&column_ids);
    break;
  case TIMESTAMP_NS:
    WriteData<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::CTimestampNsConverter>
              (column,this,&column_ids);
    break;
  case DECIMAL:
    pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(this_02,col);
    PVar1 = pvVar7->physical_type_;
    if (PVar1 == INT128) goto switchD_00a0df79_caseD_32;
    if (PVar1 == INT32) {
      WriteData<int,duckdb_hugeint,duckdb::CDecimalConverter<int>>(column,this,&column_ids);
    }
    else if (PVar1 == INT64) {
      WriteData<long,duckdb_hugeint,duckdb::CDecimalConverter<long>>(column,this,&column_ids);
    }
    else {
      if (PVar1 != INT16) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(this_02,col);
        TypeIdToString_abi_cxx11_((string *)&__end2,(duckdb *)(ulong)pvVar7->physical_type_,type);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__begin2,"Unsupported physical type for Decimal",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__end2);
        ::std::runtime_error::runtime_error(this_01,(string *)&__begin2);
        __cxa_throw(this_01,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      WriteData<short,duckdb_hugeint,duckdb::CDecimalConverter<short>>(column,this,&column_ids);
    }
    break;
  case FLOAT:
    WriteData<float,float,duckdb::CStandardConverter>(column,this,&column_ids);
    break;
  case DOUBLE:
    WriteData<double,double,duckdb::CStandardConverter>(column,this,&column_ids);
    break;
  default:
    goto switchD_00a0df79_caseD_18;
  case VARCHAR:
    WriteData<duckdb::string_t,char_const*,duckdb::CStringConverter>(column,this,&column_ids);
    break;
  case BLOB:
    WriteData<duckdb::string_t,duckdb_blob,duckdb::CBlobConverter>(column,this,&column_ids);
    break;
  case INTERVAL:
    WriteData<duckdb::interval_t,duckdb_interval,duckdb::CIntervalConverter>
              (column,this,&column_ids);
    break;
  case UTINYINT:
    WriteData<unsigned_char,unsigned_char,duckdb::CStandardConverter>(column,this,&column_ids);
    break;
  case USMALLINT:
    WriteData<unsigned_short,unsigned_short,duckdb::CStandardConverter>(column,this,&column_ids);
    break;
  case UINTEGER:
    WriteData<unsigned_int,unsigned_int,duckdb::CStandardConverter>(column,this,&column_ids);
    break;
  case UBIGINT:
    WriteData<unsigned_long,unsigned_long,duckdb::CStandardConverter>(column,this,&column_ids);
    break;
  case TIME_TZ:
    WriteData<duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::CStandardConverter>
              (column,this,&column_ids);
    break;
  case UHUGEINT:
    WriteData<duckdb::uhugeint_t,duckdb_uhugeint,duckdb::CUhugeintConverter>
              (column,this,&column_ids);
    break;
  case HUGEINT:
switchD_00a0df79_caseD_32:
    WriteData<duckdb::hugeint_t,duckdb_hugeint,duckdb::CHugeintConverter>(column,this,&column_ids);
  }
  dVar9 = DuckDBSuccess;
switchD_00a0df79_caseD_18:
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&column_ids);
  return dVar9;
}

Assistant:

duckdb_state deprecated_duckdb_translate_column(MaterializedQueryResult &result, duckdb_column *column, idx_t col) {
	D_ASSERT(!result.HasError());
	auto &collection = result.Collection();
	idx_t row_count = collection.Count();
	column->deprecated_nullmask = (bool *)duckdb_malloc(sizeof(bool) * collection.Count());

	auto type_size = GetCTypeSize(column->deprecated_type);
	if (type_size == 0) {
		for (idx_t row_id = 0; row_id < row_count; row_id++) {
			column->deprecated_nullmask[row_id] = false;
		}
		// Unsupported type, e.g., a LIST. By returning DuckDBSuccess here,
		// we allow filling other columns, and return NULL for all unsupported types.
		return DuckDBSuccess;
	}

	column->deprecated_data = duckdb_malloc(type_size * row_count);
	if (!column->deprecated_nullmask || !column->deprecated_data) { // LCOV_EXCL_START
		// malloc failure
		return DuckDBError;
	} // LCOV_EXCL_STOP

	vector<column_t> column_ids {col};
	// first convert the nullmask
	{
		idx_t row = 0;
		for (auto &input : collection.Chunks(column_ids)) {
			for (idx_t k = 0; k < input.size(); k++) {
				column->deprecated_nullmask[row++] = FlatVector::IsNull(input.data[0], k);
			}
		}
	}
	// then write the data
	switch (result.types[col].id()) {
	case LogicalTypeId::BOOLEAN:
		WriteData<bool>(column, collection, column_ids);
		break;
	case LogicalTypeId::TINYINT:
		WriteData<int8_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::SMALLINT:
		WriteData<int16_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::INTEGER:
		WriteData<int32_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::BIGINT:
		WriteData<int64_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::UTINYINT:
		WriteData<uint8_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::USMALLINT:
		WriteData<uint16_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::UINTEGER:
		WriteData<uint32_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::UBIGINT:
		WriteData<uint64_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::FLOAT:
		WriteData<float>(column, collection, column_ids);
		break;
	case LogicalTypeId::DOUBLE:
		WriteData<double>(column, collection, column_ids);
		break;
	case LogicalTypeId::DATE:
		WriteData<date_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::TIME:
		WriteData<dtime_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::TIME_TZ:
		WriteData<dtime_tz_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
		WriteData<timestamp_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::VARCHAR: {
		WriteData<string_t, const char *, CStringConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::BLOB: {
		WriteData<string_t, duckdb_blob, CBlobConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::TIMESTAMP_NS: {
		WriteData<timestamp_t, timestamp_t, CTimestampNsConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::TIMESTAMP_MS: {
		WriteData<timestamp_t, timestamp_t, CTimestampMsConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::TIMESTAMP_SEC: {
		WriteData<timestamp_t, timestamp_t, CTimestampSecConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::HUGEINT: {
		WriteData<hugeint_t, duckdb_hugeint, CHugeintConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::UHUGEINT: {
		WriteData<uhugeint_t, duckdb_uhugeint, CUhugeintConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::INTERVAL: {
		WriteData<interval_t, duckdb_interval, CIntervalConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::DECIMAL: {
		// get data
		switch (result.types[col].InternalType()) {
		case PhysicalType::INT16: {
			WriteData<int16_t, duckdb_hugeint, CDecimalConverter<int16_t>>(column, collection, column_ids);
			break;
		}
		case PhysicalType::INT32: {
			WriteData<int32_t, duckdb_hugeint, CDecimalConverter<int32_t>>(column, collection, column_ids);
			break;
		}
		case PhysicalType::INT64: {
			WriteData<int64_t, duckdb_hugeint, CDecimalConverter<int64_t>>(column, collection, column_ids);
			break;
		}
		case PhysicalType::INT128: {
			WriteData<hugeint_t, duckdb_hugeint, CHugeintConverter>(column, collection, column_ids);
			break;
		}
		default:
			throw std::runtime_error("Unsupported physical type for Decimal" +
			                         TypeIdToString(result.types[col].InternalType()));
		}
		break;
	}
	default: // LCOV_EXCL_START
		return DuckDBError;
	} // LCOV_EXCL_STOP
	return DuckDBSuccess;
}